

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::JoinHashTable::Probe
          (JoinHashTable *this,ScanStructure *scan_structure,DataChunk *keys,
          TupleDataChunkState *key_state,ProbeState *probe_state,
          optional_ptr<duckdb::Vector,_true> precomputed_hashes)

{
  idx_t *count;
  Vector *hashes_v;
  SelectionVector *current_sel;
  optional_ptr<duckdb::Vector,_true> precomputed_hashes_local;
  LogicalType local_b0;
  Vector hashes;
  
  precomputed_hashes_local = precomputed_hashes;
  InitializeScanStructure(this,scan_structure,keys,key_state,&current_sel);
  if (scan_structure->count != 0) {
    count = &scan_structure->count;
    if (precomputed_hashes.ptr == (Vector *)0x0) {
      LogicalType::LogicalType(&local_b0,UBIGINT);
      Vector::Vector(&hashes,&local_b0,0x800);
      LogicalType::~LogicalType(&local_b0);
      Hash(this,keys,current_sel,*count,&hashes);
      GetRowPointers(this,keys,key_state,probe_state,&hashes,current_sel,count,
                     &scan_structure->pointers,&scan_structure->sel_vector);
      Vector::~Vector(&hashes);
    }
    else {
      hashes_v = optional_ptr<duckdb::Vector,_true>::operator*(&precomputed_hashes_local);
      GetRowPointers(this,keys,key_state,probe_state,hashes_v,current_sel,count,
                     &scan_structure->pointers,&scan_structure->sel_vector);
    }
  }
  return;
}

Assistant:

void JoinHashTable::Probe(ScanStructure &scan_structure, DataChunk &keys, TupleDataChunkState &key_state,
                          ProbeState &probe_state, optional_ptr<Vector> precomputed_hashes) {
	const SelectionVector *current_sel;
	InitializeScanStructure(scan_structure, keys, key_state, current_sel);
	if (scan_structure.count == 0) {
		return;
	}

	if (precomputed_hashes) {
		GetRowPointers(keys, key_state, probe_state, *precomputed_hashes, *current_sel, scan_structure.count,
		               scan_structure.pointers, scan_structure.sel_vector);
	} else {
		Vector hashes(LogicalType::HASH);
		// hash all the keys
		Hash(keys, *current_sel, scan_structure.count, hashes);

		// now initialize the pointers of the scan structure based on the hashes
		GetRowPointers(keys, key_state, probe_state, hashes, *current_sel, scan_structure.count,
		               scan_structure.pointers, scan_structure.sel_vector);
	}
}